

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_scaling_operations.c
# Opt level: O0

void WebRtcSpl_ScaleVector
               (int16_t *in_vector,int16_t *out_vector,int16_t gain,size_t in_vector_length,
               int16_t right_shifts)

{
  int16_t *local_48;
  int16_t *outptr;
  int16_t *inptr;
  size_t i;
  int16_t right_shifts_local;
  size_t in_vector_length_local;
  int16_t gain_local;
  int16_t *out_vector_local;
  int16_t *in_vector_local;
  
  local_48 = out_vector;
  outptr = in_vector;
  for (inptr = (int16_t *)0x0; inptr < in_vector_length; inptr = (int16_t *)((long)inptr + 1)) {
    *local_48 = (int16_t)((int)*outptr * (int)gain >> ((byte)right_shifts & 0x1f));
    local_48 = local_48 + 1;
    outptr = outptr + 1;
  }
  return;
}

Assistant:

void WebRtcSpl_ScaleVector(const int16_t *in_vector, int16_t *out_vector,
                           int16_t gain, size_t in_vector_length,
                           int16_t right_shifts)
{
    // Performs vector operation: out_vector = (gain*in_vector)>>right_shifts
    size_t i;
    const int16_t *inptr;
    int16_t *outptr;

    inptr = in_vector;
    outptr = out_vector;

    for (i = 0; i < in_vector_length; i++)
    {
      *outptr++ = (int16_t)((*inptr++ * gain) >> right_shifts);
    }
}